

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O3

void __thiscall cmDebugServerJson::OnChangeState(cmDebugServerJson *this)

{
  string local_30;
  
  StatusString_abi_cxx11_(&local_30,this);
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDebugServerJson::OnChangeState()
{
  AsyncBroadcast(StatusString());
}